

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

uint32_t random32(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  if (random32()::dev == '\0') {
    iVar1 = __cxa_guard_acquire(&random32()::dev);
    if (iVar1 != 0) {
      std::random_device::random_device(&random32::dev);
      __cxa_atexit(std::random_device::~random_device,&random32::dev,&__dso_handle);
      __cxa_guard_release(&random32()::dev);
    }
  }
  if (random32()::raand == '\0') {
    iVar1 = __cxa_guard_acquire(&random32()::raand);
    if (iVar1 != 0) {
      uVar2 = std::random_device::_M_getval();
      uVar3 = uVar2 / 0x7fffffff << 0x1f | uVar2 / 0x7fffffff;
      random32::raand._M_x = (unsigned_long)(uVar3 + uVar2 + (uint)(uVar2 + uVar3 == 0));
      __cxa_guard_release(&random32()::raand);
    }
  }
  random32::raand._M_x = (random32::raand._M_x * 0xbc8f) % 0x7fffffff;
  return (uint32_t)random32::raand._M_x;
}

Assistant:

uint32_t random32()
{
    static std::random_device dev;
    static std::minstd_rand raand(dev());
    return raand();
}